

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::sampleNearest1D
          (tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,IVec2 *offset)

{
  uint uVar1;
  WrapMode WVar2;
  int i;
  uint uVar3;
  TextureChannelClass TVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  Vector<float,_4> *res;
  float fVar9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar10;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar11;
  Vec4 VVar12;
  tcu local_38 [16];
  
  uVar1 = (access->m_size).m_data[0];
  fVar9 = floorf(u);
  WVar2 = sampler->wrapS;
  uVar6 = 0;
  if (MIRRORED_ONCE < WVar2) goto switchD_019e3ea2_default;
  uVar3 = (int)fVar9 + offset->m_data[0];
  uVar5 = uVar3;
  switch(WVar2) {
  default:
switchD_019e3e32_caseD_0:
    uVar5 = uVar1 - 1;
    if ((int)uVar3 < (int)(uVar1 - 1)) {
      uVar5 = uVar3;
    }
    uVar6 = 0;
    if (-1 < (int)uVar3) {
      uVar6 = uVar5;
    }
    break;
  case CLAMP_TO_BORDER:
    if ((int)uVar3 < 0 || (int)uVar1 <= (int)uVar3) {
      TVar4 = getTextureChannelClass((access->m_format).type);
      switch(TVar4) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        VVar11 = sampleTextureBorder<float>(this,&access->m_format,sampler);
        in_XMM1_Qa = VVar11.m_data._8_8_;
        fVar9 = VVar11.m_data[0];
        fVar10 = VVar11.m_data[1];
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        sampleTextureBorder<int>(local_38,&access->m_format,sampler);
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
        lVar7 = 0;
        do {
          fVar10 = 0.0;
          fVar9 = (float)*(int *)(local_38 + lVar7 * 4);
          *(float *)(this + lVar7 * 4) = fVar9;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        sampleTextureBorder<unsigned_int>(local_38,&access->m_format,sampler);
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
        lVar7 = 0;
        do {
          fVar10 = 0.0;
          fVar9 = (float)*(uint *)(local_38 + lVar7 * 4);
          *(float *)(this + lVar7 * 4) = fVar9;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        break;
      default:
        lVar7 = 0;
        do {
          *(undefined4 *)(this + lVar7 * 4) = 0xbf800000;
          lVar7 = lVar7 + 1;
          fVar9 = extraout_XMM0_Da;
          fVar10 = extraout_XMM0_Db;
        } while (lVar7 != 4);
      }
      goto LAB_019e3f02;
    }
    switch(WVar2) {
    case CLAMP_TO_EDGE:
    case MIRRORED_REPEAT_CL:
      goto switchD_019e3e32_caseD_0;
    case CLAMP_TO_BORDER:
      if ((int)uVar3 < (int)uVar1) {
        uVar1 = uVar3;
      }
      uVar6 = 0xffffffff;
      if (-2 < (int)uVar3) {
        uVar6 = uVar1;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      goto switchD_019e3e32_caseD_2;
    case MIRRORED_REPEAT_GL:
      goto switchD_019e3e32_caseD_4;
    case MIRRORED_ONCE:
      goto switchD_019e3e32_caseD_6;
    }
    break;
  case REPEAT_GL:
  case REPEAT_CL:
switchD_019e3e32_caseD_2:
    uVar6 = ((int)uVar3 % (int)uVar1 >> 0x1f & uVar1) + (int)uVar3 % (int)uVar1;
    break;
  case MIRRORED_ONCE:
switchD_019e3e32_caseD_6:
    uVar5 = uVar1;
    if ((int)uVar3 < (int)uVar1) {
      uVar5 = uVar3;
    }
    if (SBORROW4(uVar3,-uVar1) != (int)(uVar3 + uVar1) < 0) {
      uVar5 = -uVar1;
    }
  case MIRRORED_REPEAT_GL:
switchD_019e3e32_caseD_4:
    iVar8 = (int)uVar5 % (int)(uVar1 * 2);
    uVar6 = (iVar8 - uVar1) + (iVar8 >> 0x1f & uVar1 * 2);
    uVar6 = ~((int)uVar6 >> 0x1f ^ uVar6) + uVar1;
  }
switchD_019e3ea2_default:
  VVar12 = lookup((ConstPixelBufferAccess *)this,(int)access,uVar6,offset->m_data[1]);
  in_XMM1_Qa = VVar12.m_data._8_8_;
  fVar9 = VVar12.m_data[0];
  fVar10 = VVar12.m_data[1];
LAB_019e3f02:
  VVar12.m_data[1] = fVar10;
  VVar12.m_data[0] = fVar9;
  VVar12.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar12.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Vec4)VVar12.m_data;
}

Assistant:

static Vec4 sampleNearest1D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, const IVec2& offset)
{
	int width	= access.getWidth();

	int x = deFloorFloatToInt32(u)+offset.x();

	// Check for CLAMP_TO_BORDER.
	if (sampler.wrapS == Sampler::CLAMP_TO_BORDER && !deInBounds32(x, 0, width))
		return lookupBorder(access.getFormat(), sampler);

	int i = wrap(sampler.wrapS, x, width);

	return lookup(access, i, offset.y(), 0);
}